

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

int __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::copy
          (ImageTemplate<unsigned_char> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint32_t uVar1;
  undefined8 uVar2;
  int extraout_EAX;
  uchar *out;
  imageException *this_00;
  
  if ((EVP_PKEY_CTX)this->_type != dst[0x20]) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Cannot copy image of one type to another type.");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  clear(this);
  uVar2 = *(undefined8 *)(dst + 8);
  this->_width = (int)uVar2;
  this->_height = (int)((ulong)uVar2 >> 0x20);
  this->_colorCount = (uint8_t)dst[0x10];
  uVar1 = *(uint32_t *)(dst + 0x14);
  this->_rowSize = uVar1;
  this->_alignment = (uint8_t)dst[0x11];
  if (*(long *)(dst + 0x18) != 0) {
    out = _allocate(this,(ulong)(uVar1 * (int)((ulong)uVar2 >> 0x20)));
    this->_data = out;
    _copy(this,out,*(uchar **)(dst + 0x18),(ulong)this->_rowSize * (ulong)this->_height);
    return extraout_EAX;
  }
  return (int)uVar2;
}

Assistant:

void copy( const ImageTemplate & image )
        {
            if( _type != image._type )
                throw imageException( "Cannot copy image of one type to another type." );

            clear();

            _width  = image._width;
            _height = image._height;

            _colorCount = image._colorCount;
            _rowSize    = image._rowSize;
            _alignment  = image._alignment;

            if( image._data != nullptr ) {
                _data = _allocate( _height * _rowSize );

                _copy( _data, image._data, sizeof( TColorDepth ) * _height * _rowSize );
            }
        }